

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O2

TIdSentences * __thiscall
NJamSpell::TLangModel::ConvertToIds
          (TIdSentences *__return_storage_ptr__,TLangModel *this,TSentences *sentences)

{
  long lVar1;
  long lVar2;
  size_t j;
  ulong uVar3;
  pointer pvVar4;
  undefined1 auStack_68 [8];
  TWordIds wordIds;
  TWordId local_3c;
  TIdSentences *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wordIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = __return_storage_ptr__;
  while( true ) {
    pvVar4 = (sentences->
             super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((pointer)(((long)(sentences->
                         super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4) / 0x18) <=
        wordIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) break;
    wordIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pvVar4 = pvVar4 + (long)wordIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage;
    auStack_68 = (undefined1  [8])0x0;
    wordIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    lVar2 = 0;
    for (uVar3 = 0;
        lVar1 = *(long *)&(pvVar4->
                          super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
                          _M_impl.super__Vector_impl_data,
        uVar3 < (ulong)((long)*(pointer *)
                               ((long)&(pvVar4->
                                       super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                                       )._M_impl.super__Vector_impl_data + 8) - lVar1 >> 4);
        uVar3 = uVar3 + 1) {
      local_3c = GetWordId(this,(TWord *)(lVar1 + lVar2));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_68,&local_3c);
      lVar2 = lVar2 + 0x10;
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::push_back(local_38,(value_type *)auStack_68);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_68);
    wordIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)wordIds.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  return local_38;
}

Assistant:

TIdSentences TLangModel::ConvertToIds(const TSentences& sentences) {
    TIdSentences newSentences;
    for (size_t i = 0; i < sentences.size(); ++i) {
        const TWords& words = sentences[i];
        TWordIds wordIds;
        for (size_t j = 0; j < words.size(); ++j) {
            const TWord& word = words[j];
            wordIds.push_back(GetWordId(word));
        }
        newSentences.push_back(wordIds);
    }
    return newSentences;
}